

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bossac.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  int iVar3;
  pointer pSVar4;
  ulong uVar5;
  undefined8 uVar6;
  FlashPtr *this;
  pointer pFVar7;
  socklen_t sVar8;
  undefined1 *puVar9;
  char *pcVar10;
  size_t in_R9;
  bool bVar11;
  float fVar12;
  exception *e;
  uint32_t totalErrors;
  uint32_t pageErrors;
  FlasherInfo info;
  Flasher flasher;
  BossaObserver observer;
  FlashPtr *flash;
  Device device;
  undefined1 local_f8 [23];
  bool res;
  unique_ptr<SerialPort,_std::default_delete<SerialPort>_> local_e0;
  Ptr port;
  undefined1 local_b8 [8];
  PortFactory portFactory;
  Samba samba;
  undefined1 local_50 [8];
  CmdOpts cmd;
  char *pos;
  int args;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  puVar9 = (undefined1 *)0x13;
  CmdOpts::CmdOpts((CmdOpts *)local_50,argc,argv,0x13,opts);
  cmd._opts = (Option *)strrchr(*argv,0x2f);
  if ((cmd._opts != (Option *)0x0) ||
     (cmd._opts = (Option *)strrchr(*argv,0x5c), cmd._opts != (Option *)0x0)) {
    puVar9 = &(cmd._opts)->field_0x1;
    *argv = puVar9;
  }
  sVar8 = (socklen_t)puVar9;
  if (argc < 2) {
    fprintf(_stderr,"%s: you must specify at least one option\n",*argv);
    argv_local._4_4_ = help(*argv);
    goto LAB_0010757e;
  }
  iVar1 = CmdOpts::parse((CmdOpts *)local_50);
  if (iVar1 < 0) {
    argv_local._4_4_ = help(*argv);
    goto LAB_0010757e;
  }
  if (((config.read & 1U) != 0) && (((config.write & 1U) != 0 || ((config.verify & 1U) != 0)))) {
    fprintf(_stderr,"%s: read option is exclusive of write or verify\n",*argv);
    argv_local._4_4_ = help(*argv);
    goto LAB_0010757e;
  }
  if ((((config.read & 1U) != 0) || ((config.write & 1U) != 0)) ||
     (argv_local._0_4_ = argc, (config.verify & 1U) != 0)) {
    if (iVar1 == argc) {
      fprintf(_stderr,"%s: missing file\n",*argv);
      argv_local._4_4_ = help(*argv);
      goto LAB_0010757e;
    }
    argv_local._0_4_ = argc + -1;
  }
  if (iVar1 != (int)argv_local) {
    fprintf(_stderr,"%s: extra arguments found\n",*argv);
    argv_local._4_4_ = help(*argv);
    goto LAB_0010757e;
  }
  if (((config.help & 1U) != 0) || ((config.version & 1U) != 0)) {
    if ((config.help & 1U) != 0) {
      printf("Usage: %s [OPTION...] [FILE]\n",*argv);
    }
    printf(
          "Basic Open Source SAM-BA Application (BOSSA) Version \nFlash programmer for Atmel SAM devices.\nCopyright (c) 2011-2018 ShumaTech (http://www.shumatech.com)\n"
          );
    if ((config.help & 1U) != 0) {
      printf(
            "\nExamples:\n  bossac -e -w -v -b image.bin   # Erase flash, write flash with image.bin,\n                                 # verify the write, and set boot from flash\n  bossac -r0x10000 image.bin     # Read 64KB from flash and store in image.bin\n"
            );
      printf("\nOptions:\n");
      CmdOpts::usage((CmdOpts *)local_50,_stdout);
      printf("\nReport bugs to <bugs@shumatech.com>\n");
    }
    argv_local._4_4_ = 0;
    goto LAB_0010757e;
  }
  Samba::Samba((Samba *)&portFactory._dir);
  LinuxPortFactory::LinuxPortFactory((LinuxPortFactory *)local_b8);
  if ((config.debug & 1U) != 0) {
    Samba::setDebug((Samba *)&portFactory._dir,true);
  }
  if ((config.port & 1U) == 0) {
    LinuxPortFactory::def_abi_cxx11_((string *)&port,(LinuxPortFactory *)local_b8);
    std::__cxx11::string::operator=((string *)&config.portArg,(string *)&port);
    std::__cxx11::string::~string((string *)&port);
  }
  if ((config.arduinoErase & 1U) == 0) {
LAB_00106e63:
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      if ((config.usbPort & 1U) == 0) {
        LinuxPortFactory::create((LinuxPortFactory *)&device._family,(string *)local_b8);
        iVar3 = Samba::connect((Samba *)&portFactory._dir,(int)&device._family,(sockaddr *)0x1c200,
                               sVar8);
        local_f8[0xf] = (byte)iVar3 & 1;
        std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::~unique_ptr
                  ((unique_ptr<SerialPort,_std::default_delete<SerialPort>_> *)&device._family);
      }
      else {
        sVar8 = config.usbPortArg & 1;
        LinuxPortFactory::create((LinuxPortFactory *)local_f8,(string *)local_b8,true);
        iVar3 = Samba::connect((Samba *)&portFactory._dir,(int)local_f8,(sockaddr *)0x1c200,sVar8);
        local_f8[0xf] = (byte)iVar3 & 1;
        std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::~unique_ptr
                  ((unique_ptr<SerialPort,_std::default_delete<SerialPort>_> *)local_f8);
      }
      __stream = _stderr;
      if ((local_f8[0xf] & 1) == 0) {
        uVar6 = std::__cxx11::string::c_str();
        fprintf(__stream,"No device found on %s\n",uVar6);
        argv_local._4_4_ = 1;
        bVar11 = true;
      }
      else {
        Device::Device((Device *)&flash,(Samba *)&portFactory._dir);
        Device::create((Device *)&flash);
        this = Device::getFlash((Device *)&flash);
        BossaObserver::BossaObserver((BossaObserver *)&flasher._observer);
        Flasher::Flasher((Flasher *)
                         &info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,(Samba *)&portFactory._dir,
                         (Device *)&flash,(FlasherObserver *)&flasher._observer);
        if ((config.info & 1U) != 0) {
          FlasherInfo::FlasherInfo((FlasherInfo *)&totalErrors);
          Flasher::info((Flasher *)
                        &info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,(FlasherInfo *)&totalErrors);
          FlasherInfo::print((FlasherInfo *)&totalErrors);
          FlasherInfo::~FlasherInfo((FlasherInfo *)&totalErrors);
        }
        if ((config.unlock & 1U) != 0) {
          Flasher::lock((Flasher *)
                        &info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,&config.unlockArg,false);
        }
        if ((config.erase & 1U) != 0) {
          timer_start();
          Flasher::erase((Flasher *)
                         &info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,config.offsetArg);
          fVar12 = timer_stop();
          printf("\nDone in %5.3f seconds\n",(double)fVar12);
        }
        if ((config.write & 1U) != 0) {
          timer_start();
          Flasher::write((Flasher *)
                         &info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,(int)argv[iVar1],
                         (void *)(ulong)(uint)config.offsetArg,(long)iVar1);
          fVar12 = timer_stop();
          printf("\nDone in %5.3f seconds\n",(double)fVar12);
        }
        if ((config.verify & 1U) == 0) {
LAB_00107245:
          if ((config.read & 1U) != 0) {
            timer_start();
            Flasher::read((Flasher *)
                          &info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage,(int)argv[iVar1],
                          (void *)(ulong)(uint)config.readArg,(ulong)(uint)config.offsetArg);
            fVar12 = timer_stop();
            printf("\nDone in %5.3f seconds\n",(double)fVar12);
          }
          if ((config.boot & 1U) != 0) {
            pcVar10 = "false";
            if (config.bootArg != 0) {
              pcVar10 = "true";
            }
            printf("Set boot flash %s\n",pcVar10);
            pFVar7 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this);
            (*pFVar7->_vptr_Flash[0x15])(pFVar7,(ulong)(config.bootArg != 0));
          }
          if ((config.bod & 1U) != 0) {
            pcVar10 = "false";
            if (config.bodArg != 0) {
              pcVar10 = "true";
            }
            printf("Set brownout detect %s\n",pcVar10);
            pFVar7 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this);
            (*pFVar7->_vptr_Flash[0xf])(pFVar7,(ulong)(config.bodArg != 0));
          }
          if ((config.bor & 1U) != 0) {
            pcVar10 = "false";
            if (config.borArg != 0) {
              pcVar10 = "true";
            }
            printf("Set brownout reset %s\n",pcVar10);
            pFVar7 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this);
            (*pFVar7->_vptr_Flash[0x12])(pFVar7,(ulong)(config.borArg != 0));
          }
          if ((config.security & 1U) != 0) {
            printf("Set security\n");
            pFVar7 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this);
            (*pFVar7->_vptr_Flash[0xd])();
          }
          if ((config.lock & 1U) != 0) {
            Flasher::lock((Flasher *)
                          &info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage,&config.lockArg,true);
          }
          pFVar7 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this);
          (*pFVar7->_vptr_Flash[0x17])();
          if ((config.reset & 1U) != 0) {
            Device::reset((Device *)&flash);
          }
          bVar11 = false;
        }
        else {
          timer_start();
          uVar2 = Flasher::verify((Flasher *)
                                  &info.lockRegions.super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data._M_end_of_storage,
                                  (EVP_PKEY_CTX *)argv[iVar1],(uchar *)((long)&e + 4),(size_t)&e,
                                  (uchar *)(ulong)(uint)config.offsetArg,in_R9);
          if ((uVar2 & 1) != 0) {
            fVar12 = timer_stop();
            printf("\nVerify successful\nDone in %5.3f seconds\n",(double)fVar12);
            goto LAB_00107245;
          }
          printf("\nVerify failed\nPage errors: %d\nByte errors: %d\n",(ulong)e._4_4_,(ulong)(uint)e
                );
          argv_local._4_4_ = 2;
          bVar11 = true;
        }
        Flasher::~Flasher((Flasher *)
                          &info.lockRegions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage);
        BossaObserver::~BossaObserver((BossaObserver *)&flasher._observer);
        Device::~Device((Device *)&flash);
      }
    }
    else {
      fprintf(_stderr,"No serial ports available\n");
      argv_local._4_4_ = 1;
      bVar11 = true;
    }
  }
  else {
    std::unique_ptr<SerialPort,std::default_delete<SerialPort>>::
    unique_ptr<std::default_delete<SerialPort>,void>
              ((unique_ptr<SerialPort,std::default_delete<SerialPort>> *)&local_e0);
    LinuxPortFactory::create((LinuxPortFactory *)(local_f8 + 0x10),(string *)local_b8,true);
    std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator=
              (&local_e0,
               (unique_ptr<SerialPort,_std::default_delete<SerialPort>_> *)(local_f8 + 0x10));
    std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::~unique_ptr
              ((unique_ptr<SerialPort,_std::default_delete<SerialPort>_> *)(local_f8 + 0x10));
    pSVar4 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&local_e0);
    sVar8 = 0;
    uVar2 = (*pSVar4->_vptr_SerialPort[2])(pSVar4,0x4b0,8);
    bVar11 = (uVar2 & 1) != 0;
    if (bVar11) {
      pSVar4 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&local_e0);
      (*pSVar4->_vptr_SerialPort[0xc])(pSVar4,1);
      pSVar4 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&local_e0);
      (*pSVar4->_vptr_SerialPort[0xb])(pSVar4,0);
      pSVar4 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&local_e0);
      (*pSVar4->_vptr_SerialPort[3])();
    }
    else {
      fprintf(_stderr,"Failed to open port at 1200bps\n");
    }
    argv_local._4_4_ = (uint)!bVar11;
    bVar11 = !bVar11;
    std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::~unique_ptr(&local_e0);
    if (!bVar11) goto LAB_00106e63;
  }
  LinuxPortFactory::~LinuxPortFactory((LinuxPortFactory *)local_b8);
  Samba::~Samba((Samba *)&portFactory._dir);
  if (!bVar11) {
    argv_local._4_4_ = 0;
  }
LAB_0010757e:
  CmdOpts::~CmdOpts((CmdOpts *)local_50);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char* argv[])
{
    int args;
    char* pos;
    CmdOpts cmd(argc, argv, sizeof(opts) / sizeof(opts[0]), opts);

    if ((pos = strrchr(argv[0], '/')) || (pos = strrchr(argv[0], '\\')))
        argv[0] = pos + 1;

    if (argc <= 1)
    {
        fprintf(stderr, "%s: you must specify at least one option\n", argv[0]);
        return help(argv[0]);
    }

    args = cmd.parse();
    if (args < 0)
        return help(argv[0]);

    if (config.read && (config.write || config.verify))
    {
        fprintf(stderr, "%s: read option is exclusive of write or verify\n", argv[0]);
        return help(argv[0]);
    }

    if (config.read || config.write || config.verify)
    {
        if (args == argc)
        {
            fprintf(stderr, "%s: missing file\n", argv[0]);
            return help(argv[0]);
        }
        argc--;
    }
    if (args != argc)
    {
        fprintf(stderr, "%s: extra arguments found\n", argv[0]);
        return help(argv[0]);
    }

    if (config.help || config.version)
    {
        if (config.help)
            printf("Usage: %s [OPTION...] [FILE]\n", argv[0]);
        printf("Basic Open Source SAM-BA Application (BOSSA) Version \n"
               "Flash programmer for Atmel SAM devices.\n"
               "Copyright (c) 2011-2018 ShumaTech (http://www.shumatech.com)\n"
              );
        if (config.help)
        {
            printf("\n"
                   "Examples:\n"
                   "  bossac -e -w -v -b image.bin   # Erase flash, write flash with image.bin,\n"
                   "                                 # verify the write, and set boot from flash\n"
                   "  bossac -r0x10000 image.bin     # Read 64KB from flash and store in image.bin\n"
                  );
            printf("\nOptions:\n");
            cmd.usage(stdout);
            printf("\nReport bugs to <bugs@shumatech.com>\n");
        }
        return 0;
    }

    try
    {
        Samba samba;
        PortFactory portFactory;

        if (config.debug)
            samba.setDebug(true);

        if (!config.port)
            config.portArg = portFactory.def();

        if (config.arduinoErase)
        {
            SerialPort::Ptr port;
            port = portFactory.create(config.portArg, config.usbPortArg != 0);

            if(!port->open(1200))
            {
                fprintf(stderr, "Failed to open port at 1200bps\n");
                return 1;
            }

            port->setRTS(true);
            port->setDTR(false);
            port->close();
        }

        if (config.portArg.empty())
        {
            fprintf(stderr, "No serial ports available\n");
            return 1;
        }

        bool res;
        if (config.usbPort)
            res = samba.connect(portFactory.create(config.portArg, config.usbPortArg != 0));
        else
            res = samba.connect(portFactory.create(config.portArg));
        if (!res)
        {
            fprintf(stderr, "No device found on %s\n", config.portArg.c_str());
            return 1;
        }

        Device device(samba);
        device.create();

        Device::FlashPtr& flash = device.getFlash();

        BossaObserver observer;
        Flasher flasher(samba, device, observer);

        if (config.info)
        {
            FlasherInfo info;
            flasher.info(info);
            info.print();
        }

        if (config.unlock)
            flasher.lock(config.unlockArg, false);

        if (config.erase)
        {
            timer_start();
            flasher.erase(config.offsetArg);
            printf("\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.write)
        {
            timer_start();
            flasher.write(argv[args], config.offsetArg);
            printf("\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.verify)
        {
            uint32_t pageErrors;
            uint32_t totalErrors;

            timer_start();
            if (!flasher.verify(argv[args], pageErrors, totalErrors, config.offsetArg))
            {
                printf("\nVerify failed\nPage errors: %d\nByte errors: %d\n",
                    pageErrors, totalErrors);
                return 2;
            }

            printf("\nVerify successful\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.read)
        {
            timer_start();
            flasher.read(argv[args], config.readArg, config.offsetArg);
            printf("\nDone in %5.3f seconds\n", timer_stop());
        }

        if (config.boot)
        {
            printf("Set boot flash %s\n", config.bootArg ? "true" : "false");
            flash->setBootFlash(config.bootArg);
        }

        if (config.bod)
        {
            printf("Set brownout detect %s\n", config.bodArg ? "true" : "false");
            flash->setBod(config.bodArg);
        }

        if (config.bor)
        {
            printf("Set brownout reset %s\n", config.borArg ? "true" : "false");
            flash->setBor(config.borArg);
        }

        if (config.security)
        {
            printf("Set security\n");
            flash->setSecurity();
        }

        if (config.lock)
            flasher.lock(config.lockArg, true);

        flash->writeOptions();

        if (config.reset)
            device.reset();
    }
    catch (exception& e)
    {
        fprintf(stderr, "\n%s\n", e.what());
        return 1;
    }
    catch(...)
    {
        fprintf(stderr, "\nUnhandled exception\n");
        return 1;
    }

    return 0;
}